

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  ulong uVar1;
  int i;
  long lVar2;
  undefined1 *__src;
  undefined1 *__src_00;
  char cVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t __n;
  size_t __n_00;
  undefined1 local_88;
  char acStack_87 [12];
  undefined4 uStack_7b;
  undefined4 uStack_77;
  undefined8 uStack_73;
  undefined4 local_6b;
  undefined1 local_58;
  char acStack_57 [12];
  undefined4 uStack_4b;
  undefined4 uStack_47;
  undefined8 uStack_43;
  undefined4 local_3b;
  
  __src_00 = &local_88;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_serialize_der_cold_4();
  }
  else if (output != (uchar *)0x0) {
    if (outputlen == (size_t *)0x0) {
      secp256k1_ecdsa_signature_serialize_der_cold_2();
      return 0;
    }
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_signature_serialize_der_cold_1();
      return 0;
    }
    lVar2 = 0;
    uVar7 = 0;
    do {
      uVar4 = (uint)sig->data[lVar2] | uVar7 << 8;
      uVar7 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
      if (uVar4 < 0xd) {
        uVar7 = uVar4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar7);
    lVar2 = 0;
    uVar4 = 0;
    do {
      uVar5 = (uint)sig->data[lVar2 + 0x20] | uVar4 << 8;
      uVar4 = uVar5 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc);
      if (uVar5 < 0xd) {
        uVar4 = uVar5;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    local_58 = 0;
    acStack_57[0] = '\0';
    acStack_57[1] = '\0';
    acStack_57[2] = '\0';
    acStack_57[3] = '\0';
    acStack_57[4] = '\0';
    acStack_57[5] = '\0';
    acStack_57[6] = '\0';
    acStack_57[7] = 0;
    acStack_57[8] = '\0';
    acStack_57[9] = '\0';
    acStack_57[10] = '\0';
    acStack_57[0xb] = '\0';
    uStack_4b = (uint)uStack_4b._3_1_ << 0x18;
    local_88 = 0;
    acStack_87[0] = '\0';
    acStack_87[1] = '\0';
    acStack_87[2] = '\0';
    acStack_87[3] = '\0';
    acStack_87[4] = '\0';
    acStack_87[5] = '\0';
    acStack_87[6] = '\0';
    acStack_87[7] = 0;
    acStack_87[8] = '\0';
    acStack_87[9] = '\0';
    acStack_87[10] = '\0';
    acStack_87[0xb] = '\0';
    uStack_7b = (uint)uStack_7b._3_1_ << 0x18;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar7);
    uStack_47 = 0;
    uStack_43 = 0;
    acStack_57[0] = '\0';
    acStack_57[1] = '\0';
    acStack_57[2] = '\0';
    acStack_57[3] = '\0';
    acStack_57[4] = '\0';
    acStack_57[5] = '\0';
    acStack_57[6] = '\0';
    acStack_57[7] = 0;
    acStack_57[8] = '\0';
    acStack_57[9] = '\0';
    acStack_57[10] = '\0';
    acStack_57[0xb] = '\0';
    uStack_4b = 0;
    local_3b = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    uStack_77 = 0;
    uStack_73 = 0;
    acStack_87[0] = '\0';
    acStack_87[1] = '\0';
    acStack_87[2] = '\0';
    acStack_87[3] = '\0';
    acStack_87[4] = '\0';
    acStack_87[5] = '\0';
    acStack_87[6] = '\0';
    acStack_87[7] = 0;
    acStack_87[8] = '\0';
    acStack_87[9] = '\0';
    acStack_87[10] = '\0';
    acStack_87[0xb] = '\0';
    uStack_7b = 0;
    local_6b = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    __n_00 = 0x21;
    __src = &local_58;
    cVar3 = '\0';
    do {
      if ((cVar3 != '\0') || (cVar3 = __src[1], cVar3 < '\0')) goto LAB_0010793c;
      __n_00 = __n_00 - 1;
      __src = __src + 1;
    } while (__n_00 != 1);
    __n_00 = 1;
    __src = (undefined1 *)((long)&local_3b + 3);
LAB_0010793c:
    __n = 0x21;
    cVar3 = '\0';
    do {
      if ((cVar3 != '\0') || (cVar3 = __src_00[1], cVar3 < '\0')) goto LAB_00107967;
      __n = __n - 1;
      __src_00 = __src_00 + 1;
    } while (__n != 1);
    __n = 1;
    __src_00 = (undefined1 *)((long)&local_6b + 3);
LAB_00107967:
    uVar6 = __n + 6 + __n_00;
    uVar1 = *outputlen;
    *outputlen = uVar6;
    if (uVar6 <= uVar1) {
      *output = '0';
      output[1] = (uchar)__n + (uchar)__n_00 + '\x04';
      output[2] = '\x02';
      output[3] = (uchar)__n_00;
      memcpy(output + 4,__src,__n_00);
      output[__n_00 + 4] = '\x02';
      output[__n_00 + 5] = (uchar)__n;
      memcpy(output + __n_00 + 6,__src_00,__n);
      return 1;
    }
    return 0;
  }
  secp256k1_ecdsa_signature_serialize_der_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}